

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

bool __thiscall slang::ast::Scope::isProceduralContext(Scope *this)

{
  Symbol *pSVar1;
  Scope *in_RDI;
  bool local_1;
  
  pSVar1 = asSymbol(in_RDI);
  if ((pSVar1->kind - ProceduralBlock < 2) || (pSVar1->kind == Subroutine)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Scope::isProceduralContext() const {
    switch (asSymbol().kind) {
        case SymbolKind::ProceduralBlock:
        case SymbolKind::StatementBlock:
        case SymbolKind::Subroutine:
            return true;
        default:
            return false;
    }
}